

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_TestShell::
~TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_TestShell
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_TestShell
           *this)

{
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_TestShell
  *this_local;
  
  ~TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithSizeTLineWorks_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteOverloadsWithSizeTLineWorks)
{
    const size_t line = 42;
    char* leak = new("TestFile.cpp", line) char;

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}